

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fiber.c
# Opt level: O2

void sx_coro_update(sx_coro_context *ctx,float dt)

{
  sx__coro_state *psVar1;
  code *pcVar2;
  int iVar3;
  sx_fiber_t pvVar4;
  sx__coro_state *psVar5;
  float fVar6;
  
  if (ctx->cur_coro != (sx__coro_state *)0x0) {
    sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                      0xf5,"ctx->cur_coro == NULL");
    pcVar2 = (code *)swi(3);
    (*pcVar2)();
    return;
  }
  psVar1 = ctx->run_list;
LAB_0010988d:
  do {
    psVar5 = psVar1;
    if (psVar5 == (sx__coro_state *)0x0) {
      return;
    }
    psVar1 = psVar5->next;
    if (psVar5->ret_state == CORO_RET_WAIT) goto LAB_001098ba;
    if (psVar5->ret_state != CORO_RET_YIELD) {
      sx__debug_message("/workspace/llm4binary/github/license_c_cmakelists/septag[P]sx/src/fiber.c",
                        0x10e,"Invalid ret type in update loop");
      pcVar2 = (code *)swi(3);
      (*pcVar2)();
      return;
    }
    iVar3 = (psVar5->counter).n + 1;
    (psVar5->counter).n = iVar3;
  } while (iVar3 < (psVar5->arg).n);
  goto LAB_001098d3;
LAB_001098ba:
  fVar6 = (psVar5->counter).tm + dt;
  (psVar5->counter).tm = fVar6;
  if ((psVar5->arg).tm <= fVar6) {
LAB_001098d3:
    ctx->cur_coro = psVar5;
    pvVar4 = (sx_fiber_t)jump_fcontext(psVar5->fiber,psVar5->user);
    psVar5->fiber = pvVar4;
  }
  goto LAB_0010988d;
}

Assistant:

void sx_coro_update(sx_coro_context* ctx, float dt)
{
    sx_assert(ctx->cur_coro == NULL);

    sx__coro_state* fs = ctx->run_list;
    while (fs) {
        sx__coro_state* next = fs->next;

        // Check state and take action for pending fibers
        switch (fs->ret_state) {
        case CORO_RET_YIELD: {
            ++fs->counter.n;
            if (fs->counter.n >= fs->arg.n) {
                ctx->cur_coro = fs;
                fs->fiber = sx_fiber_switch(fs->fiber, fs->user).from;
            }
            break;
        }
        case CORO_RET_WAIT: {
            fs->counter.tm += dt;
            if (fs->counter.tm >= fs->arg.tm) {
                ctx->cur_coro = fs;
                fs->fiber = sx_fiber_switch(fs->fiber, fs->user).from;
            }
            break;
        }
        default:
            sx_assertf(0, "Invalid ret type in update loop");
            break;
        }

        fs = next;
    }
}